

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeep.cpp
# Opt level: O2

Complex __thiscall libDAI::TreeEP::logZ(TreeEP *this)

{
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *Qb;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *Qa;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  const_iterator cVar3;
  long lVar4;
  long lVar5;
  pointer pVVar6;
  size_t beta;
  ulong uVar7;
  undefined1 auVar8 [16];
  TFactor<double> local_a0;
  TFactor<double> local_68;
  
  Qb = &(this->super_JTree)._Qb;
  lVar4 = 0x20;
  uVar7 = 0;
  while( true ) {
    iVar2 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
              [4])(this);
    if ((ulong)((*(long *)(CONCAT44(extraout_var,iVar2) + 0x100) -
                *(long *)(CONCAT44(extraout_var,iVar2) + 0xf8)) / 0x28) <= uVar7) break;
    TProb<double>::entropy
              ((TProb<double> *)
               ((long)&(((Qb->
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4));
    uVar7 = uVar7 + 1;
    lVar4 = lVar4 + 0x38;
  }
  Qa = &(this->super_JTree)._Qa;
  lVar4 = 0x20;
  uVar7 = 0;
  while( true ) {
    iVar2 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
              [4])(this);
    if ((ulong)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 0xe8) -
                *(long *)(CONCAT44(extraout_var_00,iVar2) + 0xe0) >> 6) <= uVar7) break;
    TProb<double>::entropy
              ((TProb<double> *)
               ((long)&(((Qa->
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4));
    uVar7 = uVar7 + 1;
    lVar4 = lVar4 + 0x38;
  }
  lVar4 = 0;
  lVar5 = 0;
  uVar7 = 0;
  while( true ) {
    iVar2 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
              [4])(this);
    if ((ulong)(*(long *)(CONCAT44(extraout_var_01,iVar2) + 0xe8) -
                *(long *)(CONCAT44(extraout_var_01,iVar2) + 0xe0) >> 6) <= uVar7) break;
    iVar2 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
              [4])(this);
    TFactor<double>::log0
              (&local_68,
               (TFactor<double> *)(*(long *)(CONCAT44(extraout_var_02,iVar2) + 0xe0) + lVar4));
    TFactor<double>::operator*
              (&local_a0,&local_68,
               (TFactor<double> *)
               ((long)&(((this->super_JTree)._Qa.
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar5));
    TProb<double>::totalSum(&local_a0._p);
    TFactor<double>::~TFactor(&local_a0);
    TFactor<double>::~TFactor(&local_68);
    uVar7 = uVar7 + 1;
    lVar5 = lVar5 + 0x38;
    lVar4 = lVar4 + 0x40;
  }
  pVVar6 = (pointer)0x0;
  while( true ) {
    local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = pVVar6;
    iVar2 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
              [4])(this);
    auVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x48))
                       ((long *)CONCAT44(extraout_var_03,iVar2));
    if (auVar8._0_8_ <= pVVar6) break;
    bVar1 = offtree(this,(size_t)local_a0._vs._vars.
                                 super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    if (bVar1) {
      cVar3 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>,_std::_Select1st<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
              ::find(&(this->_Q)._M_t,(key_type *)&local_a0);
      TreeEPSubTree::logZ((TreeEPSubTree *)&cVar3._M_node[1]._M_parent,Qa,Qb);
    }
    pVVar6 = (pointer)((long)&(local_a0._vs._vars.
                               super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                               .super__Vector_impl_data._M_start)->_label + 1);
  }
  return (Complex)(_ComplexT)auVar8;
}

Assistant:

Complex TreeEP::logZ() const {
        double sum = 0.0;

        // entropy of the tree
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            sum -= real(_Qb[beta].entropy());
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            sum += real(_Qa[alpha].entropy());

        // energy of the on-tree factors
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            sum += (grm().OR(alpha).log0() * _Qa[alpha]).totalSum();

        // energy of the off-tree factors
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            if( offtree(I) )
                sum += (_Q.find(I))->second.logZ( _Qa, _Qb );
        
        return sum;
    }